

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double deranged_pdf(int x,int a)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (x <= a && -1 < x) {
    iVar1 = i4_choose(a,x);
    iVar2 = deranged_enum(a - x);
    dVar3 = r8_factorial(a);
    dVar3 = (double)(iVar2 * iVar1) / dVar3;
  }
  return dVar3;
}

Assistant:

double deranged_pdf ( int x, int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_PDF evaluates the Deranged PDF.
//
//  Discussion:
//
//    PDF(A;X) is the probability that exactly X items will occur in
//    their proper place after a random permutation of A items.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the number of items in their correct places.
//    0 <= X <= A.
//
//    Input, int A, the total number of items.
//    1 <= A.
//
//    Output, double PDF, the value of the PDF.
//
{
  int cnk;
  int dnmk;
  double pdf;

  if ( x < 0 || a < x )
  {
    pdf = 0.0;
  }
  else
  {
    cnk = i4_choose ( a, x );
    dnmk = deranged_enum ( a - x );
    pdf = static_cast< double >( cnk * dnmk ) / r8_factorial ( a );
  }

  return pdf;
}